

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

int __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::EffectiveSideOrder
          (TPZCompElHCurl<pzshape::TPZShapeCube> *this,int side)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  string local_1c0 [32];
  stringstream sout;
  ostream local_190 [376];
  
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x248))();
  if (iVar1 == 0) {
    return -1;
  }
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x310))(this,side);
  if (iVar1 < 0) {
    iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (iVar2 <= iVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&sout);
      poVar3 = std::operator<<(local_190,
                               "virtual int TPZCompElHCurl<pzshape::TPZShapeCube>::EffectiveSideOrder(int) const [TSHAPE = pzshape::TPZShapeCube]"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<(local_190,"Connect index out of range connect ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      poVar3 = std::operator<<(poVar3," nconnects ");
      iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x90))(this);
      std::ostream::operator<<(poVar3,iVar1);
      std::__cxx11::stringbuf::str();
      poVar3 = std::operator<<((ostream *)&std::cerr,local_1c0);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string(local_1c0);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                 ,0x11c);
    }
  }
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x3c0))(this,iVar1);
  return iVar1;
}

Assistant:

int TPZCompElHCurl<TSHAPE>::EffectiveSideOrder(int side) const{
	if(!NSideConnects(side)) return -1;
	const auto connect = this->MidSideConnectLocId( side);
	if(connect >= 0 || connect < NConnects()){
        return ConnectOrder(connect);
	}
    else{
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__<<std::endl;
        sout << "Connect index out of range connect " << connect << " nconnects " << NConnects();
        PZError<<sout.str()<<std::endl;
#ifdef PZ_LOG
        LOGPZ_ERROR(logger, sout.str())
#endif
        DebugStop();
    }
	return -1;
}